

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_fold.hpp
# Opt level: O1

ans_fold_decode<5U> *
ans_fold_decode<5U>::load(ans_fold_decode<5U> *__return_storage_ptr__,uint8_t *in_u8)

{
  uint uVar1;
  pointer puVar2;
  pointer puVar3;
  pointer pdVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined8 uVar8;
  byte bVar9;
  byte bVar10;
  int iVar11;
  uint64_t uVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  uint uVar18;
  ushort uVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 extraout_var [56];
  undefined1 auVar26 [64];
  undefined1 in_XMM6 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->table).
  super__Vector_base<dec_entry_fold,_std::allocator<dec_entry_fold>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->table).
  super__Vector_base<dec_entry_fold,_std::allocator<dec_entry_fold>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->table).
  super__Vector_base<dec_entry_fold,_std::allocator<dec_entry_fold>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ans_load_interp(&local_38,in_u8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            (&__return_storage_ptr__->nfreqs,&local_38);
  if (local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  puVar2 = (__return_storage_ptr__->nfreqs).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (__return_storage_ptr__->nfreqs).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar2 == puVar3) {
    uVar12 = 0;
  }
  else {
    auVar21 = vpbroadcastq_avx512f();
    auVar21 = vpsrlq_avx512f(auVar21,2);
    auVar26 = ZEXT1664((undefined1  [16])0x0);
    uVar15 = 0;
    auVar22 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar23 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar24 = vmovdqa64_avx512f(auVar26);
      auVar26 = vpbroadcastq_avx512f();
      auVar25 = vporq_avx512f(auVar26,auVar22);
      auVar26 = vporq_avx512f(auVar26,auVar23);
      uVar8 = vpcmpuq_avx512f(auVar26,auVar21,2);
      bVar9 = (byte)uVar8;
      uVar8 = vpcmpuq_avx512f(auVar25,auVar21,2);
      bVar10 = (byte)uVar8;
      uVar19 = CONCAT11(bVar10,bVar9);
      auVar26 = vmovdqu32_avx512f(*(undefined1 (*) [64])(puVar2 + uVar15));
      auVar25._4_4_ = (uint)((byte)(uVar19 >> 1) & 1) * auVar26._4_4_;
      auVar25._0_4_ = (uint)(bVar9 & 1) * auVar26._0_4_;
      auVar25._8_4_ = (uint)((byte)(uVar19 >> 2) & 1) * auVar26._8_4_;
      auVar25._12_4_ = (uint)((byte)(uVar19 >> 3) & 1) * auVar26._12_4_;
      auVar25._16_4_ = (uint)((byte)(uVar19 >> 4) & 1) * auVar26._16_4_;
      auVar25._20_4_ = (uint)((byte)(uVar19 >> 5) & 1) * auVar26._20_4_;
      auVar25._24_4_ = (uint)((byte)(uVar19 >> 6) & 1) * auVar26._24_4_;
      auVar25._28_4_ = (uint)((byte)(uVar19 >> 7) & 1) * auVar26._28_4_;
      auVar25._32_4_ = (uint)(bVar10 & 1) * auVar26._32_4_;
      auVar25._36_4_ = (uint)(bVar10 >> 1 & 1) * auVar26._36_4_;
      auVar25._40_4_ = (uint)(bVar10 >> 2 & 1) * auVar26._40_4_;
      auVar25._44_4_ = (uint)(bVar10 >> 3 & 1) * auVar26._44_4_;
      auVar25._48_4_ = (uint)(bVar10 >> 4 & 1) * auVar26._48_4_;
      auVar25._52_4_ = (uint)(bVar10 >> 5 & 1) * auVar26._52_4_;
      auVar25._56_4_ = (uint)(bVar10 >> 6 & 1) * auVar26._56_4_;
      auVar25._60_4_ = (uint)(bVar10 >> 7) * auVar26._60_4_;
      auVar26 = vpaddd_avx512f(auVar25,auVar24);
      uVar15 = uVar15 + 0x10;
    } while ((((ulong)((long)puVar3 + (-4 - (long)puVar2)) >> 2) + 0x10 & 0xfffffffffffffff0) !=
             uVar15);
    auVar21 = vmovdqa32_avx512f(auVar26);
    auVar22._0_4_ = (uint)(bVar9 & 1) * auVar21._0_4_ | (uint)!(bool)(bVar9 & 1) * auVar24._0_4_;
    bVar5 = (bool)((byte)(uVar19 >> 1) & 1);
    auVar22._4_4_ = (uint)bVar5 * auVar21._4_4_ | (uint)!bVar5 * auVar24._4_4_;
    bVar5 = (bool)((byte)(uVar19 >> 2) & 1);
    auVar22._8_4_ = (uint)bVar5 * auVar21._8_4_ | (uint)!bVar5 * auVar24._8_4_;
    bVar5 = (bool)((byte)(uVar19 >> 3) & 1);
    auVar22._12_4_ = (uint)bVar5 * auVar21._12_4_ | (uint)!bVar5 * auVar24._12_4_;
    bVar5 = (bool)((byte)(uVar19 >> 4) & 1);
    auVar22._16_4_ = (uint)bVar5 * auVar21._16_4_ | (uint)!bVar5 * auVar24._16_4_;
    bVar5 = (bool)((byte)(uVar19 >> 5) & 1);
    auVar22._20_4_ = (uint)bVar5 * auVar21._20_4_ | (uint)!bVar5 * auVar24._20_4_;
    bVar5 = (bool)((byte)(uVar19 >> 6) & 1);
    auVar22._24_4_ = (uint)bVar5 * auVar21._24_4_ | (uint)!bVar5 * auVar24._24_4_;
    bVar5 = (bool)((byte)(uVar19 >> 7) & 1);
    auVar22._28_4_ = (uint)bVar5 * auVar21._28_4_ | (uint)!bVar5 * auVar24._28_4_;
    auVar22._32_4_ =
         (uint)(bVar10 & 1) * auVar21._32_4_ | (uint)!(bool)(bVar10 & 1) * auVar24._32_4_;
    bVar5 = (bool)(bVar10 >> 1 & 1);
    auVar22._36_4_ = (uint)bVar5 * auVar21._36_4_ | (uint)!bVar5 * auVar24._36_4_;
    bVar5 = (bool)(bVar10 >> 2 & 1);
    auVar22._40_4_ = (uint)bVar5 * auVar21._40_4_ | (uint)!bVar5 * auVar24._40_4_;
    bVar5 = (bool)(bVar10 >> 3 & 1);
    auVar22._44_4_ = (uint)bVar5 * auVar21._44_4_ | (uint)!bVar5 * auVar24._44_4_;
    bVar5 = (bool)(bVar10 >> 4 & 1);
    auVar22._48_4_ = (uint)bVar5 * auVar21._48_4_ | (uint)!bVar5 * auVar24._48_4_;
    bVar5 = (bool)(bVar10 >> 5 & 1);
    auVar22._52_4_ = (uint)bVar5 * auVar21._52_4_ | (uint)!bVar5 * auVar24._52_4_;
    bVar5 = (bool)(bVar10 >> 6 & 1);
    auVar22._56_4_ = (uint)bVar5 * auVar21._56_4_ | (uint)!bVar5 * auVar24._56_4_;
    auVar22._60_4_ =
         (uint)(bVar10 >> 7) * auVar21._60_4_ | (uint)!(bool)(bVar10 >> 7) * auVar24._60_4_;
    auVar20 = vextracti64x4_avx512f(auVar22,1);
    auVar21 = vpaddd_avx512f(auVar22,ZEXT3264(auVar20));
    auVar6 = vpaddd_avx(auVar21._0_16_,auVar21._16_16_);
    auVar7 = vpshufd_avx(auVar6,0xee);
    auVar6 = vpaddd_avx(auVar6,auVar7);
    auVar7 = vpshufd_avx(auVar6,0x55);
    auVar6 = vpaddd_avx(auVar6,auVar7);
    uVar12 = (uint64_t)auVar6._0_4_;
  }
  __return_storage_ptr__->frame_size = uVar12;
  __return_storage_ptr__->frame_mask = uVar12 - 1;
  auVar6 = vcvtusi2sd_avx512f(in_XMM6,uVar12);
  auVar21._0_8_ = log2(auVar6._0_8_);
  auVar21._8_56_ = extraout_var;
  uVar12 = vcvttsd2usi_avx512f(auVar21._0_16_);
  __return_storage_ptr__->frame_log2 = uVar12;
  std::vector<dec_entry_fold,_std::allocator<dec_entry_fold>_>::resize
            (&__return_storage_ptr__->table,__return_storage_ptr__->frame_size);
  puVar2 = (__return_storage_ptr__->nfreqs).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar13 = (long)(__return_storage_ptr__->nfreqs).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)puVar2 >> 2;
  pdVar4 = (__return_storage_ptr__->table).
           super__Vector_base<dec_entry_fold,_std::allocator<dec_entry_fold>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar16 = 0;
  iVar17 = 0;
  do {
    uVar1 = puVar2[lVar16];
    if ((ulong)uVar1 != 0) {
      uVar18 = (uint)lVar16;
      iVar11 = (int)(((ulong)(uVar18 & 0xfffffff0) - 0x1000) / 0xff0);
      uVar14 = iVar11 * 0x40000000 + 0x40000000 +
               ((iVar11 + 1) * -0xff0 + uVar18 << ((ulong)(iVar11 * 8 + 8) & 0x3f));
      if (uVar18 < 0x1000) {
        uVar14 = uVar18;
      }
      uVar15 = 0;
      do {
        uVar18 = iVar17 + (int)uVar15;
        pdVar4[uVar18].freq = (uint16_t)uVar1;
        pdVar4[uVar18].mapped_num = uVar14;
        pdVar4[uVar18].offset = (uint16_t)uVar15;
        uVar15 = uVar15 + 1;
      } while (uVar1 != uVar15);
    }
    iVar17 = iVar17 + puVar2[lVar16];
    lVar16 = lVar16 + 1;
  } while (lVar16 != lVar13 + (ulong)(lVar13 == 0));
  __return_storage_ptr__->lower_bound = __return_storage_ptr__->frame_size << 4;
  return __return_storage_ptr__;
}

Assistant:

static ans_fold_decode load(const uint8_t* in_u8)
    {
        ans_fold_decode model;
        model.nfreqs = ans_load_interp(in_u8);
        auto max_norm_freq
            = *std::max_element(model.nfreqs.begin(), model.nfreqs.end());
        model.frame_size = std::accumulate(
            std::begin(model.nfreqs), std::end(model.nfreqs), 0);
        model.frame_mask = model.frame_size - 1;
        model.frame_log2 = log2(model.frame_size);
        model.table.resize(model.frame_size);
        auto max_sym = model.nfreqs.size() - 1;
        uint64_t tmp = constants::K * constants::RADIX;
        uint32_t cur_base = 0;
        for (size_t sym = 0; sym <= max_sym; sym++) {
            auto cur_freq = model.nfreqs[sym];
            for (uint32_t k = 0; k < cur_freq; k++) {
                model.table[cur_base + k].freq = cur_freq;
                uint32_t except_bytes = ans_fold_exception_bytes<fidelity>(sym);
                model.table[cur_base + k].mapped_num
                    = ans_fold_undo_mapping<fidelity>(sym)
                    + (except_bytes << 30);
                model.table[cur_base + k].offset = k;
            }
            cur_base += model.nfreqs[sym];
        }
        model.lower_bound = constants::K * model.frame_size;
        return model;
    }